

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::PrettyUnitTestResultPrinter::PrintFailedTestSuites(UnitTest *unit_test)

{
  pointer piVar1;
  bool bVar2;
  pointer ppTVar3;
  UnitTestImpl *pUVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  TestSuite *pTVar8;
  
  pUVar4 = unit_test->impl_;
  ppTVar3 = (pUVar4->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(pUVar4->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3) >> 3) < 1) {
    uVar7 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      piVar1 = (pUVar4->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((lVar6 < (int)((ulong)((long)(pUVar4->test_suite_indices_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) &&
         (-1 < piVar1[lVar6])) {
        pTVar8 = ppTVar3[lVar6];
      }
      else {
        pTVar8 = (TestSuite *)0x0;
      }
      if ((pTVar8->should_run_ == true) &&
         (bVar2 = TestResult::Failed(&pTVar8->ad_hoc_test_result_), bVar2)) {
        ColoredPrintf(kRed,"[  FAILED  ] ");
        printf("%s: SetUpTestSuite or TearDownTestSuite\n",(pTVar8->name_)._M_dataplus._M_p);
        uVar7 = uVar7 + 1;
      }
      lVar6 = lVar6 + 1;
      pUVar4 = unit_test->impl_;
      ppTVar3 = (pUVar4->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(pUVar4->test_suites_).
                                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3)
                          >> 3));
  }
  if ((int)uVar7 < 1) {
    return;
  }
  pcVar5 = "SUITES";
  if (uVar7 == 1) {
    pcVar5 = "SUITE";
  }
  printf("\n%2d FAILED TEST %s\n",(ulong)uVar7,pcVar5);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::PrintFailedTestSuites(
    const UnitTest& unit_test) {
  int suite_failure_count = 0;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    const TestSuite& test_suite = *unit_test.GetTestSuite(i);
    if (!test_suite.should_run()) {
      continue;
    }
    if (test_suite.ad_hoc_test_result().Failed()) {
      ColoredPrintf(GTestColor::kRed, "[  FAILED  ] ");
      printf("%s: SetUpTestSuite or TearDownTestSuite\n", test_suite.name());
      ++suite_failure_count;
    }
  }
  if (suite_failure_count > 0) {
    printf("\n%2d FAILED TEST %s\n", suite_failure_count,
           suite_failure_count == 1 ? "SUITE" : "SUITES");
  }
}